

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STPathSet.cpp
# Opt level: O0

bool __thiscall jbcoin::STPathSet::isEquivalent(STPathSet *this,STBase *t)

{
  bool local_39;
  long local_38;
  STPathSet *v;
  STBase *t_local;
  STPathSet *this_local;
  
  if (t == (STBase *)0x0) {
    local_38 = 0;
  }
  else {
    local_38 = __dynamic_cast(t,&STBase::typeinfo,&typeinfo,0);
  }
  local_39 = false;
  if (local_38 != 0) {
    local_39 = std::operator==(&this->value,
                               (vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_> *)
                               (local_38 + 0x10));
  }
  return local_39;
}

Assistant:

bool
STPathSet::isEquivalent (const STBase& t) const
{
    const STPathSet* v = dynamic_cast<const STPathSet*> (&t);
    return v && (value == v->value);
}